

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

green_poller_t green_poller_init(green_loop_t_conflict loop,size_t size)

{
  int *piVar1;
  long lVar2;
  ucontext_t *puVar3;
  ucontext_t *puVar4;
  long lVar5;
  long lVar6;
  green_poller_t pgVar7;
  green_future_t *ppgVar8;
  uint uStack_44;
  
  if (size == 0 || loop == (green_loop_t_conflict)0x0) {
    return (green_poller_t)0x0;
  }
  if (0 < loop->refs) {
    pgVar7 = (green_poller_t)green_malloc(0x30);
    pgVar7->loop = loop;
    pgVar7->refs = 1;
    ppgVar8 = (green_future_t *)green_malloc((int)size * 8);
    pgVar7->futures = ppgVar8;
    pgVar7->size = size;
    return pgVar7;
  }
  green_poller_init_cold_1();
  if (loop == (green_loop_t_conflict)0x0) {
    return (green_poller_t)0x0;
  }
  lVar2._0_4_ = loop->refs;
  lVar2._4_4_ = loop->coroutines;
  if (lVar2 == 0) {
    green_poller_size_cold_3();
  }
  else {
    puVar3 = (loop->context).uc_link;
    puVar4 = (ucontext_t *)(loop->context).uc_stack.ss_sp;
    if (puVar3 <= puVar4) {
      if (puVar3 < *(ucontext_t **)&(loop->context).uc_stack.ss_flags) {
        green_poller_size_cold_1();
        return (green_poller_t)0x0;
      }
      return (green_poller_t)puVar4;
    }
  }
  green_poller_size_cold_2();
  if (loop == (green_loop_t_conflict)0x0) {
    return (green_poller_t)0x0;
  }
  lVar5._0_4_ = loop->refs;
  lVar5._4_4_ = loop->coroutines;
  if (lVar5 == 0) {
    green_poller_used_cold_3();
  }
  else {
    puVar3 = (loop->context).uc_link;
    if (puVar3 <= (ucontext_t *)(loop->context).uc_stack.ss_sp) {
      if (puVar3 < *(ucontext_t **)&(loop->context).uc_stack.ss_flags) {
        green_poller_used_cold_1();
        return (green_poller_t)0x0;
      }
      return (green_poller_t)puVar3;
    }
  }
  green_poller_used_cold_2();
  if (loop == (green_loop_t_conflict)0x0) {
    return (green_poller_t)0x0;
  }
  lVar6._0_4_ = loop->refs;
  lVar6._4_4_ = loop->coroutines;
  if (lVar6 == 0) {
    green_poller_done_cold_3();
  }
  else {
    puVar3 = (loop->context).uc_link;
    if (puVar3 <= (ucontext_t *)(loop->context).uc_stack.ss_sp) {
      piVar1 = &(loop->context).uc_stack.ss_flags;
      if (puVar3 < *(ucontext_t **)piVar1) {
        green_poller_done_cold_1();
        return (green_poller_t)0x0;
      }
      return (green_poller_t)((long)puVar3 - *(long *)piVar1);
    }
  }
  green_poller_done_cold_2();
  if (loop != (green_loop_t_conflict)0x0) {
    if (0 < loop->nextcoroid) {
      loop->nextcoroid = loop->nextcoroid + 1;
      return (green_poller_t)0x0;
    }
    green_poller_acquire_cold_1();
    if (loop == (green_loop_t_conflict)0x0) {
      return (green_poller_t)0x1;
    }
    green_future_release_cold_1();
    return (green_poller_t)(ulong)uStack_44;
  }
  return (green_poller_t)0x1;
}

Assistant:

green_poller_t green_poller_init(green_loop_t loop, size_t size)
{
    if ((loop == NULL) || (size == 0)) {
        return NULL;
    }
    green_assert(loop->refs > 0);

    green_poller_t poller = green_malloc(sizeof(struct green_poller));
    poller->loop = loop;
    poller->refs = 1;
    poller->futures = green_malloc(size * sizeof(green_future_t));
    poller->size = size;

    return poller;
}